

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void pubkeyExceptionTest(string *hex)

{
  bool bVar1;
  _Vector_impl_data in_stack_ffffffffffffff98;
  Pubkey pubkey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  cfd::core::Pubkey::Pubkey(&pubkey);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffffa0,(string *)hex);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffa0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffa0);
  }
  testing::Message::Message((Message *)&stack0xffffffffffffffa0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_pubkey.cpp"
             ,99,
             "Expected: (pubkey = Pubkey(hex)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffffa0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffffa0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ByteData::ByteData((ByteData *)&local_30,(string *)hex);
    cfd::core::Pubkey::Pubkey
              ((Pubkey *)&stack0xffffffffffffffa0,(ByteData)in_stack_ffffffffffffff98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffa0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffa0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  }
  testing::Message::Message((Message *)&stack0xffffffffffffffa0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_pubkey.cpp"
             ,100,
             "Expected: (pubkey = Pubkey(ByteData(hex))) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffffa0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffffa0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  return;
}

Assistant:

void pubkeyExceptionTest(std::string hex) {
  Pubkey pubkey;
  EXPECT_THROW((pubkey = Pubkey(hex)), CfdException);
  EXPECT_THROW((pubkey = Pubkey(ByteData(hex))), CfdException);
}